

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

bool __thiscall capnp::DynamicStruct::Builder::has(Builder *this,StringPtr name,HasMode mode)

{
  Field field;
  bool bVar1;
  Field local_68;
  HasMode local_21;
  Builder *pBStack_20;
  HasMode mode_local;
  Builder *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (Builder *)name.content.ptr;
  local_21 = mode;
  pBStack_20 = this;
  StructSchema::getFieldByName(&local_68,&this->schema,name);
  field.index = local_68.index;
  field._12_4_ = local_68._12_4_;
  field.parent.super_Schema.raw = local_68.parent.super_Schema.raw;
  field.proto._reader.segment = local_68.proto._reader.segment;
  field.proto._reader.capTable = local_68.proto._reader.capTable;
  field.proto._reader.data = local_68.proto._reader.data;
  field.proto._reader.pointers = local_68.proto._reader.pointers;
  field.proto._reader.dataSize = local_68.proto._reader.dataSize;
  field.proto._reader.pointerCount = local_68.proto._reader.pointerCount;
  field.proto._reader._38_2_ = local_68.proto._reader._38_2_;
  field.proto._reader.nestingLimit = local_68.proto._reader.nestingLimit;
  field.proto._reader._44_4_ = local_68.proto._reader._44_4_;
  bVar1 = has(this,field,local_21);
  return bVar1;
}

Assistant:

bool DynamicStruct::Builder::has(kj::StringPtr name, HasMode mode) {
  return has(schema.getFieldByName(name), mode);
}